

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall
crnlib::crn_comp::optimize_color_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  uint8 *puVar1;
  Node *this_00;
  float fVar2;
  uint8 uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  vector<unsigned_short> *this_01;
  unsigned_short *puVar7;
  level_details *plVar8;
  endpoint_indices_details *peVar9;
  bool bVar10;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar11;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar12;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar13;
  uint level;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uchar *puVar19;
  uint uVar20;
  int iVar21;
  unpacked_endpoint *puVar22;
  color_quad_u8 *c0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar23;
  vector<unsigned_char> *packed_data;
  int iVar24;
  uint8 uVar25;
  uchar *puVar26;
  uchar *puVar27;
  uint uVar28;
  ulong uVar29;
  uint16 i_2;
  long lVar30;
  ulong uVar31;
  long lVar32;
  uint16 i;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_198;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_194;
  vector<unsigned_int> hist;
  int local_17c;
  ulong local_178;
  uint local_164;
  ulong local_160;
  ulong local_158;
  static_huffman_data_model dm;
  symbol_codec codec;
  
  this_01 = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar4 = *(ushort *)((long)pData_ptr + 0x10);
  uVar29 = (ulong)uVar4;
  vector<unsigned_short>::resize(this_01,(uint)uVar4,false);
  uVar28 = (uint)uVar4;
  if (data == 0) {
    lVar32 = *pData_ptr;
    vector<unsigned_short>::resize(this_01,(uint)uVar4,false);
    vector<crnlib::optimize_color_params::unpacked_endpoint>::vector
              ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)&codec,(uint)uVar4);
    vector<unsigned_short>::vector((vector<unsigned_short> *)&dm,(uint)uVar4);
    for (uVar33 = 0; uVar33 != uVar29; uVar33 = uVar33 + 1) {
      optimize_color_params::unpacked_endpoint::operator=
                ((unpacked_endpoint *)(codec.m_pDecode_buf + uVar33 * 8),
                 (unpacked_endpoint *)(lVar32 + uVar33 * 8));
      *(short *)(dm._0_8_ + uVar33 * 2) = (short)uVar33;
    }
    hist.m_p = (uint *)0xff000000ff000000;
    local_178 = uVar29;
    while (uVar33 = local_178 - 1, local_178 != 0) {
      lVar32 = 0;
      uVar18 = 0;
      uVar28 = 0xffffffff;
      for (uVar34 = 0; puVar1 = codec.m_pDecode_buf, local_178 != uVar34; uVar34 = uVar34 + 1) {
        uVar14 = crnlib::color::elucidian_distance
                           ((color_quad_u8 *)(codec.m_pDecode_buf + lVar32),(color_quad_u8 *)&hist,
                            false);
        uVar15 = crnlib::color::elucidian_distance
                           ((color_quad_u8 *)(puVar1 + lVar32 + 4),
                            (color_quad_u8 *)((long)&hist.m_p + 4),false);
        uVar20 = (uint)uVar34;
        uVar17 = uVar15 + uVar14;
        if (uVar28 <= uVar15 + uVar14) {
          uVar20 = (uint)uVar18;
          uVar17 = uVar28;
        }
        uVar28 = uVar17;
        lVar32 = lVar32 + 8;
        uVar18 = (ulong)uVar20;
      }
      uVar18 = uVar18 & 0xffff;
      uVar34 = (ulong)(uint)((int)uVar18 << 3);
      hist.m_p._0_2_ = CONCAT11(codec.m_pDecode_buf[uVar34 + 1],codec.m_pDecode_buf[uVar34]);
      hist.m_p._0_3_ = CONCAT12(codec.m_pDecode_buf[uVar34 + 2],hist.m_p._0_2_);
      hist.m_p._0_4_ = CONCAT13(codec.m_pDecode_buf[uVar34 + 3],hist.m_p._0_3_);
      hist.m_p._0_5_ = CONCAT14(codec.m_pDecode_buf[uVar34 + 4],hist.m_p._0_4_);
      hist.m_p._0_6_ = CONCAT15(codec.m_pDecode_buf[uVar34 + 5],hist.m_p._0_5_);
      hist.m_p._0_7_ = CONCAT16(codec.m_pDecode_buf[uVar34 + 6],hist.m_p._0_6_);
      hist.m_p = (uint *)CONCAT17(codec.m_pDecode_buf[uVar34 + 7],hist.m_p._0_7_);
      this_01->m_p[*(ushort *)(dm._0_8_ + uVar18 * 2)] = uVar4 - (short)local_178;
      optimize_color_params::unpacked_endpoint::operator=
                ((unpacked_endpoint *)(codec.m_pDecode_buf + uVar34),
                 (unpacked_endpoint *)(codec.m_pDecode_buf + uVar33 * 8));
      *(undefined2 *)(dm._0_8_ + uVar18 * 2) = *(undefined2 *)(dm._0_8_ + uVar33 * 2);
      local_178 = uVar33;
    }
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&dm);
    vector<crnlib::optimize_color_params::unpacked_endpoint>::~vector
              ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)&codec);
    optimize_color_selectors(this);
  }
  else {
    puVar7 = this_01->m_p;
    puVar22 = *pData_ptr;
    lVar32 = *(long *)((long)pData_ptr + 8);
    uVar5 = *(ushort *)((long)pData_ptr + 0x12);
    fVar2 = *(float *)((long)pData_ptr + 0x14);
    codec.m_pDecode_buf = (uint8 *)0x0;
    codec.m_pDecode_buf_next = (uint8 *)0x0;
    if (uVar29 != 0) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&codec,(uint)uVar4,uVar28 == 1,0x18,vector<Node>::object_mover,
                 false);
      for (lVar30 = 0; (ulong)((uint)uVar4 - (int)codec.m_pDecode_buf_next) * 0x18 - lVar30 != 0;
          lVar30 = lVar30 + 0x18) {
        puVar1 = codec.m_pDecode_buf +
                 lVar30 + ((ulong)codec.m_pDecode_buf_next & 0xffffffff) * 0x18;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1[8] = '\0';
        puVar1[9] = '\0';
        puVar1[10] = '\0';
        puVar1[0xb] = '\0';
        puVar1[0xc] = '\0';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        puVar1[0x10] = '\0';
        puVar1[0x11] = '\0';
        puVar1[0x12] = '\0';
        puVar1[0x13] = '\0';
        puVar1[0x14] = '\0';
        puVar1[0x15] = '\0';
        puVar1[0x16] = '\0';
        puVar1[0x17] = '\0';
      }
      codec.m_pDecode_buf_next = (uint8 *)CONCAT44(codec.m_pDecode_buf_next._4_4_,uVar28);
    }
    lVar30 = 0x10;
    for (uVar33 = 0; uVar29 != uVar33; uVar33 = uVar33 + 1) {
      *(int *)(codec.m_pDecode_buf + lVar30 + -0x10) = (int)uVar33;
      optimize_color_params::unpacked_endpoint::operator=
                ((unpacked_endpoint *)(codec.m_pDecode_buf + lVar30),puVar22);
      lVar30 = lVar30 + 0x18;
      puVar22 = puVar22 + 1;
    }
    vector<unsigned_short>::vector((vector<unsigned_short> *)&dm,(uint)uVar4 * 2);
    uVar20 = (uint)uVar5;
    *(ushort *)(dm._0_8_ + uVar29 * 2) = uVar5;
    lVar30 = (ulong)uVar5 * 0x18;
    local_198.field_0.r = codec.m_pDecode_buf[lVar30 + 0x10];
    local_198.field_0.g = codec.m_pDecode_buf[lVar30 + 0x11];
    hist.m_p._0_2_ = CONCAT11(local_198.field_0.g,local_198.field_0.r);
    local_198.field_0.b = codec.m_pDecode_buf[lVar30 + 0x12];
    hist.m_p._0_3_ = CONCAT12(local_198.field_0.b,hist.m_p._0_2_);
    local_198.field_0.a = codec.m_pDecode_buf[lVar30 + 0x13];
    hist.m_p._0_4_ = CONCAT13(local_198.field_0.a,hist.m_p._0_3_);
    local_194.field_0.r = codec.m_pDecode_buf[lVar30 + 0x14];
    hist.m_p._0_5_ = CONCAT14(local_194.field_0.r,hist.m_p._0_4_);
    local_194.field_0.g = codec.m_pDecode_buf[lVar30 + 0x15];
    hist.m_p._0_6_ = CONCAT15(local_194.field_0.g,hist.m_p._0_5_);
    local_194.field_0.b = codec.m_pDecode_buf[lVar30 + 0x16];
    hist.m_p._0_7_ = CONCAT16(local_194.field_0.b,hist.m_p._0_6_);
    local_194.field_0.a = codec.m_pDecode_buf[lVar30 + 0x17];
    hist.m_p = (uint *)CONCAT17(local_194.field_0.a,hist.m_p._0_7_);
    anon_func::Node::operator=
              ((Node *)(codec.m_pDecode_buf + lVar30),
               (Node *)(codec.m_pDecode_buf + (ulong)(uVar4 - 1) * 0x18));
    uVar18 = (ulong)(uVar5 * uVar28);
    bVar10 = true;
    bVar35 = true;
    local_17c = 0;
    uVar33 = (ulong)(uVar4 - 1);
    local_160 = uVar29;
    local_158 = uVar29;
    while( true ) {
      uVar28 = (uint)local_160;
      iVar21 = (int)local_158;
      if (uVar33 == 0) break;
      uVar34 = 0;
      lVar30 = 0x14;
      uVar17 = 0;
      local_164 = 0;
      while( true ) {
        puVar1 = codec.m_pDecode_buf;
        if (uVar33 == uVar34) break;
        c0 = (color_quad_u8 *)(codec.m_pDecode_buf + lVar30 + -4);
        *(int *)(codec.m_pDecode_buf + lVar30 + -0x10) =
             *(int *)(codec.m_pDecode_buf + lVar30 + -0x10) +
             *(int *)(lVar32 + uVar18 * 4 +
                     (ulong)*(uint *)(codec.m_pDecode_buf + lVar30 + -0x14) * 4);
        iVar24 = (int)(long)(fVar2 * 4000.0 + 4000.0);
        if (bVar10) {
          uVar14 = crnlib::color::elucidian_distance(c0,(color_quad_u8 *)&hist,false);
          uVar15 = crnlib::color::elucidian_distance
                             ((color_quad_u8 *)(puVar1 + lVar30),
                              (color_quad_u8 *)((long)&hist.m_p + 4),false);
          uVar16 = uVar15 + uVar14;
          if (3999 < uVar16) {
            uVar16 = 4000;
          }
          *(uint *)(puVar1 + lVar30 + -0xc) = iVar24 - uVar16;
        }
        if (bVar35) {
          uVar14 = crnlib::color::elucidian_distance(c0,(color_quad_u8 *)&local_198.field_0,false);
          uVar15 = crnlib::color::elucidian_distance
                             ((color_quad_u8 *)(puVar1 + lVar30),(color_quad_u8 *)&local_194.field_0
                              ,false);
          uVar16 = uVar15 + uVar14;
          if (3999 < uVar16) {
            uVar16 = 4000;
          }
          uVar16 = iVar24 - uVar16;
          *(uint *)(puVar1 + lVar30 + -8) = uVar16;
        }
        else {
          uVar16 = *(uint *)(puVar1 + lVar30 + -8);
        }
        if (uVar16 < *(uint *)(puVar1 + lVar30 + -0xc)) {
          uVar16 = *(uint *)(puVar1 + lVar30 + -0xc);
        }
        uVar16 = (*(int *)(puVar1 + lVar30 + -0x10) + local_17c) * uVar16 + 1;
        if (uVar17 < uVar16) {
          uVar6 = *(uint *)(puVar1 + lVar30 + -0x14);
LAB_00150a23:
          local_164 = (uint)uVar34;
          uVar20 = uVar6;
          uVar17 = uVar16;
        }
        else if ((uVar17 == uVar16) &&
                (uVar6 = *(uint *)(puVar1 + lVar30 + -0x14), uVar6 < (uVar20 & 0xffff)))
        goto LAB_00150a23;
        uVar34 = uVar34 + 1;
        lVar30 = lVar30 + 0x18;
      }
      uVar18 = (ulong)((uVar20 & 0xffff) * (uint)uVar4);
      lVar30 = lVar32 + uVar18 * 4;
      uVar16 = 0;
      uVar17 = 0;
      uVar34 = local_158;
      uVar31 = local_160;
      for (iVar24 = uVar28 - iVar21; 0 < iVar24; iVar24 = iVar24 + -2) {
        uVar16 = uVar16 + *(int *)(lVar30 + (ulong)*(ushort *)(dm._0_8_ + uVar34 * 2) * 4) * iVar24;
        uVar17 = uVar17 + *(int *)(lVar30 + (ulong)*(ushort *)(dm._0_8_ + uVar31 * 2) * 4) * iVar24;
        uVar34 = (ulong)((int)uVar34 + 1);
        uVar31 = (ulong)((int)uVar31 - 1);
      }
      lVar30 = (ulong)local_164 * 0x18;
      this_00 = (Node *)(codec.m_pDecode_buf + lVar30);
      local_17c = *(int *)(codec.m_pDecode_buf + lVar30 + 4);
      uVar34 = (ulong)uVar16 * (ulong)*(uint *)(codec.m_pDecode_buf + lVar30 + 8);
      uVar31 = (ulong)uVar17 * (ulong)*(uint *)(codec.m_pDecode_buf + lVar30 + 0xc);
      bVar35 = uVar34 - uVar31 == 0;
      bVar10 = uVar34 >= uVar31 && !bVar35;
      if (uVar34 < uVar31 || bVar35) {
        local_160 = (ulong)(uVar28 + 1);
        *(short *)(dm._0_8_ + local_160 * 2) = (short)uVar20;
        local_198.field_0.r = (this_00->e).low.field_0.field_0.r;
        paVar11 = &local_198;
        paVar12 = &local_198;
        paVar13 = &local_198;
        paVar23 = &local_194;
        puVar19 = &local_194.field_0.g;
        puVar26 = &local_194.field_0.b;
        puVar27 = &local_194.field_0.a;
      }
      else {
        local_158 = (ulong)(iVar21 - 1);
        *(short *)(dm._0_8_ + local_158 * 2) = (short)uVar20;
        hist.m_p = (uint *)CONCAT71(hist.m_p._1_7_,(this_00->e).low.field_0.field_0.r);
        paVar11 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&hist.m_p;
        paVar12 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&hist.m_p;
        paVar13 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&hist.m_p;
        paVar23 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                  ((long)&hist.m_p + 4);
        puVar19 = (uchar *)((long)&hist.m_p + 5);
        puVar26 = (uchar *)((long)&hist.m_p + 6);
        puVar27 = (uchar *)((long)&hist.m_p + 7);
      }
      (paVar11->field_0).g = (this_00->e).low.field_0.field_0.g;
      (paVar12->field_0).b = (this_00->e).low.field_0.field_0.b;
      (paVar13->field_0).a = (this_00->e).low.field_0.field_0.a;
      (paVar23->field_0).r = (this_00->e).high.field_0.field_0.r;
      *puVar19 = (this_00->e).high.field_0.field_0.g;
      *puVar26 = (this_00->e).high.field_0.field_0.b;
      *puVar27 = (this_00->e).high.field_0.field_0.a;
      anon_func::Node::operator=
                (this_00,(Node *)(codec.m_pDecode_buf + (ulong)((int)uVar33 - 1) * 0x18));
      local_17c = local_17c << 3;
      bVar35 = uVar34 < uVar31 || uVar34 - uVar31 == 0;
      uVar33 = uVar33 - 1;
    }
    for (iVar24 = 0; uVar20 = iVar21 + iVar24 & 0xffff, uVar20 <= uVar28; iVar24 = iVar24 + 1) {
      puVar7[*(ushort *)(dm._0_8_ + (ulong)uVar20 * 2)] = (unsigned_short)iVar24;
    }
    vector<unsigned_short>::~vector((vector<unsigned_short> *)&dm);
    vector<Node>::~vector((vector<Node> *)&codec);
  }
  packed_data = (vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10);
  if (this->m_has_etc_color_blocks == true) {
    pack_color_endpoints_etc(this,packed_data,this_01);
  }
  else {
    pack_color_endpoints(this,packed_data,this_01);
  }
  iVar21 = *(int *)(*(long *)((long)pData_ptr + 0x18) + 0x18);
  vector<unsigned_int>::vector(&hist,(uint)uVar4);
  for (uVar33 = 0; uVar33 < (this->m_levels).m_size; uVar33 = uVar33 + 1) {
    plVar8 = (this->m_levels).m_p;
    uVar28 = plVar8[uVar33].first_block;
    uVar14 = plVar8[uVar33].num_blocks;
    uVar20 = 0;
    for (uVar18 = (ulong)uVar28; uVar18 < uVar14 + uVar28; uVar18 = uVar18 + 1) {
      peVar9 = (this->m_endpoint_indices).m_p;
      uVar5 = this_01->m_p[peVar9[uVar18].field_0.field_0.color];
      uVar3 = peVar9[uVar18].reference;
      uVar25 = uVar3;
      if (this->m_has_subblocks == false) {
        uVar25 = uVar3 == '\0';
      }
      if ((uVar18 & 1) == 0) {
        uVar25 = uVar3 == '\0';
      }
      if (uVar25 != '\0') {
        iVar24 = uVar5 - uVar20;
        hist.m_p[(iVar24 >> 0x1f & (uint)uVar4) + iVar24] =
             hist.m_p[(iVar24 >> 0x1f & (uint)uVar4) + iVar24] + 1;
      }
      uVar20 = (uint)uVar5;
    }
  }
  static_huffman_data_model::static_huffman_data_model(&dm);
  static_huffman_data_model::init(&dm,(EVP_PKEY_CTX *)0x1);
  uVar33 = 0;
  puVar19 = (uchar *)0x0;
  if (dm.m_code_sizes.m_size != 0) {
    puVar19 = dm.m_code_sizes.m_p;
  }
  iVar21 = iVar21 << 3;
  for (; uVar29 != uVar33; uVar33 = uVar33 + 1) {
    iVar21 = iVar21 + (uint)puVar19[uVar33] * hist.m_p[uVar33];
  }
  symbol_codec::symbol_codec(&codec);
  symbol_codec::start_encoding(&codec,0x10000);
  codec.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&codec,&dm,false,(static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&codec,false);
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = iVar21 + codec.m_total_bits_written;
  crnlib_delete<crnlib::optimize_color_params>((optimize_color_params *)pData_ptr);
  symbol_codec::~symbol_codec(&codec);
  static_huffman_data_model::~static_huffman_data_model(&dm);
  vector<unsigned_int>::~vector(&hist);
  return;
}

Assistant:

void crn_comp::optimize_color_endpoints_task(uint64 data, void* pData_ptr) {
  optimize_color_params* pParams = reinterpret_cast<optimize_color_params*>(pData_ptr);
  crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
  uint16 n = pParams->n;
  remapping.resize(n);

  if (data) {
    remap_color_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
  } else {
    sort_color_endpoints(remapping, pParams->unpacked_endpoints, n);
    optimize_color_selectors();
  }

  m_has_etc_color_blocks ? pack_color_endpoints_etc(pParams->pResult->packed_endpoints, remapping) : pack_color_endpoints(pParams->pResult->packed_endpoints, remapping);
  uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

  crnlib::vector<uint> hist(n);
  for (uint level = 0; level < m_levels.size(); level++) {
    for (uint endpoint_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++) {
      uint index = remapping[m_endpoint_indices[b].component[cColor]];
      if (m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference) {
        int sym = index - endpoint_index;
        hist[sym < 0 ? sym + n : sym]++;
      }
      endpoint_index = index;
    }
  }

  static_huffman_data_model dm;
  dm.init(true, n, hist.get_ptr(), 16);
  const uint8* code_sizes = dm.get_code_sizes();
  for (uint16 s = 0; s < n; s++)
    total_bits += hist[s] * code_sizes[s];

  symbol_codec codec;
  codec.start_encoding(64 * 1024);
  codec.encode_enable_simulation(true);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  codec.stop_encoding(false);
  total_bits += codec.encode_get_total_bits_written();

  pParams->pResult->total_bits = total_bits;

  crnlib_delete(pParams);
}